

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix-test.cc
# Opt level: O2

void __thiscall FileTest_Write_Test::TestBody(FileTest_Write_Test *this)

{
  int __fd;
  char *message;
  file write_end;
  file read_end;
  AssertHelper local_40;
  AssertionResult gtest_ar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  read_end.fd_ = -1;
  write_end.fd_ = -1;
  fmt::v5::file::pipe(&read_end,&write_end.fd_);
  __fd = 0x1452ae;
  write((int)&write_end,"test",4);
  fmt::v5::file::close(&write_end,__fd);
  read_abi_cxx11_((int)&local_28,&read_end,4);
  testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"test\"","read(read_end, std::strlen(\"test\"))",
             (char (*) [5])0x1452ae,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_28);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/posix-test.cc"
               ,0x125,message);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_28);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  fmt::v5::file::~file(&write_end);
  fmt::v5::file::~file(&read_end);
  return;
}

Assistant:

TEST(FileTest, Write) {
  file read_end, write_end;
  file::pipe(read_end, write_end);
  write(write_end, "test");
  write_end.close();
  EXPECT_READ(read_end, "test");
}